

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat.c
# Opt level: O2

int Cbs_ManAnalyze(Cbs_Man_t *p,int Level,Gia_Obj_t *pVar,Gia_Obj_t *pFan0,Gia_Obj_t *pFan1)

{
  Cbs_Que_t *p_00;
  int iVar1;
  
  if ((pVar->field_0x3 & 0x40) == 0) {
    __assert_fail("Cbs_VarIsAssigned(pVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x29b,
                  "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if ((pFan0->field_0x3 & 0x40) != 0) {
    if ((pFan1 != (Gia_Obj_t *)0x0) && ((pFan1->field_0x3 & 0x40) == 0)) {
      __assert_fail("pFan1 == NULL || Cbs_VarIsAssigned(pFan1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                    ,0x29d,
                    "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
    }
    if ((p->pClauses).iHead == (p->pClauses).iTail) {
      p_00 = &p->pClauses;
      Cbs_QuePush(p_00,(Gia_Obj_t *)0x0);
      Cbs_QuePush(p_00,pVar);
      Cbs_QuePush(p_00,pFan0);
      if (pFan1 != (Gia_Obj_t *)0x0) {
        Cbs_QuePush(p_00,pFan1);
      }
      Cbs_ManDeriveReason(p,Level);
      iVar1 = Cbs_QueFinish(p_00);
      return iVar1;
    }
    __assert_fail("Cbs_QueIsEmpty( pQue )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                  ,0x29e,
                  "int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  __assert_fail("Cbs_VarIsAssigned(pFan0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat.c"
                ,0x29c,"int Cbs_ManAnalyze(Cbs_Man_t *, int, Gia_Obj_t *, Gia_Obj_t *, Gia_Obj_t *)"
               );
}

Assistant:

static inline int Cbs_ManAnalyze( Cbs_Man_t * p, int Level, Gia_Obj_t * pVar, Gia_Obj_t * pFan0, Gia_Obj_t * pFan1 )
{
    Cbs_Que_t * pQue = &(p->pClauses);
    assert( Cbs_VarIsAssigned(pVar) );
    assert( Cbs_VarIsAssigned(pFan0) );
    assert( pFan1 == NULL || Cbs_VarIsAssigned(pFan1) );
    assert( Cbs_QueIsEmpty( pQue ) );
    Cbs_QuePush( pQue, NULL );
    Cbs_QuePush( pQue, pVar );
    Cbs_QuePush( pQue, pFan0 );
    if ( pFan1 )
        Cbs_QuePush( pQue, pFan1 );
    Cbs_ManDeriveReason( p, Level );
    return Cbs_QueFinish( pQue );
}